

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::CloneTopOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  State *__dest;
  size_t sVar7;
  Frag *pFVar8;
  size_t __n;
  uint uVar9;
  
  pcVar6 = operandStack->stackTop_;
  if ((ulong)((long)pcVar6 - (long)operandStack->stack_) < 0xc) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x92,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Frag]"
                 );
  }
  iVar1 = *(int *)(pcVar6 + -0xc);
  iVar2 = *(int *)(pcVar6 + -8);
  uVar3 = *(uint *)(pcVar6 + -4);
  uVar4 = this->stateCount_;
  uVar9 = uVar4 - uVar3;
  __dest = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,(ulong)uVar9);
  if (uVar3 < this->stateCount_) {
    __n = (ulong)uVar9 << 4;
    memcpy(__dest,(this->states_).stack_ + (ulong)uVar3 * 0x10,__n);
    if (uVar4 != uVar3) {
      sVar7 = 0;
      do {
        iVar5 = *(int *)((long)&__dest->out + sVar7);
        if (iVar5 != -1) {
          *(uint *)((long)&__dest->out + sVar7) = iVar5 + uVar9;
        }
        iVar5 = *(int *)((long)&__dest->out1 + sVar7);
        if (iVar5 != -1) {
          *(uint *)((long)&__dest->out1 + sVar7) = iVar5 + uVar9;
        }
        sVar7 = sVar7 + 0x10;
      } while (__n != sVar7);
    }
    pFVar8 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    pFVar8->start = iVar1 + uVar9;
    pFVar8->out = iVar2 + uVar9;
    pFVar8->minIndex = uVar4;
    this->stateCount_ = this->stateCount_ + uVar9;
    return;
  }
  __assert_fail("index < stateCount_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0xaa,
                "State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

Range& GetRange(SizeType index) {
        RAPIDJSON_ASSERT(index < rangeCount_);
        return ranges_.template Bottom<Range>()[index];
    }